

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.cpp
# Opt level: O3

Var __thiscall
Js::InterpreterStackFrame::
OP_LdEnvObjSlot<Js::OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>>>__unaligned>
          (InterpreterStackFrame *this,Var instance,
          OpLayoutDynamicProfile<Js::OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>_>
          *playout)

{
  ushort uVar1;
  long lVar2;
  code *pcVar3;
  bool bVar4;
  uint sourceContextId;
  DWORD DVar5;
  undefined4 *puVar6;
  long lVar7;
  ulong uVar8;
  
  uVar8 = (ulong)(playout->super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
                 SlotIndex1;
  sourceContextId = FunctionProxy::GetSourceContextId(*(FunctionProxy **)(this + 0x88));
  lVar2 = *(long *)(this + 0x88);
  lVar7 = *(long *)(lVar2 + 0x10);
  if (lVar7 == 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Base/FunctionBody.h"
                                ,0x4c1,"(GetFunctionInfo())","GetFunctionInfo()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
    lVar7 = *(long *)(lVar2 + 0x10);
  }
  bVar4 = Phases::IsEnabled((Phases *)&DAT_015a4e90,ClosureRangeCheckPhase,sourceContextId,
                            *(LocalFunctionId *)(lVar7 + 0x10));
  if ((!bVar4) && ((ulong)*(ushort *)((long)instance + 2) <= uVar8 - 1)) {
    Throw::FatalInternalError(-0x7fffbffb);
  }
  lVar2 = *(long *)((long)instance + uVar8 * 8);
  uVar1 = (playout->super_OpLayoutT_ElementSlotI2<Js::LayoutSizePolicy<(Js::LayoutSize)1>_>).
          SlotIndex2;
  DVar5 = DynamicObject::GetOffsetOfAuxSlots();
  return *(Var *)(*(long *)(lVar2 + (ulong)DVar5) + (ulong)uVar1 * 8);
}

Assistant:

Var InterpreterStackFrame::OP_LdEnvObjSlot(Var instance, const unaligned T* playout)
    {
        Var slotArray = OP_LdFrameDisplaySlot(instance, playout->SlotIndex1);
        return OP_LdObjSlot(slotArray, playout->SlotIndex2);
    }